

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O0

TIntermSelection * __thiscall
glslang::TIntermediate::addSelection
          (TIntermediate *this,TIntermTyped *cond,TIntermNodePair nodePair,TSourceLoc *loc)

{
  TIntermSelection *this_00;
  TIntermSelection *node;
  TSourceLoc *loc_local;
  TIntermTyped *cond_local;
  TIntermediate *this_local;
  TIntermNodePair nodePair_local;
  
  this_00 = (TIntermSelection *)TIntermNode::operator_new((TIntermNode *)0xd8,(size_t)cond);
  TIntermSelection::TIntermSelection(this_00,cond,nodePair.node1,nodePair.node2);
  (*(this_00->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[1])(this_00,loc);
  return this_00;
}

Assistant:

TIntermSelection* TIntermediate::addSelection(TIntermTyped* cond, TIntermNodePair nodePair, const TSourceLoc& loc)
{
    //
    // Don't prune the false path for compile-time constants; it's needed
    // for static access analysis.
    //

    TIntermSelection* node = new TIntermSelection(cond, nodePair.node1, nodePair.node2);
    node->setLoc(loc);

    return node;
}